

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O1

void __thiscall
GslSpan_FromStdArrayConstructor_Test::TestBody(GslSpan_FromStdArrayConstructor_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  array<int,_4UL> arr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  undefined1 *local_28;
  char *pcStack_20;
  
  local_28 = &DAT_200000001;
  pcStack_20 = (char *)0x400000003;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_40.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<long,long>
            (local_38,"s.size ()","static_cast<std::ptrdiff_t> (arr.size ())",(long *)&local_48,
             (long *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x17f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"s.data ()","arr.data ()",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x180,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_40.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<long,long>
            (local_38,"cs.size ()","static_cast<std::ptrdiff_t> (arr.size ())",(long *)&local_48,
             (long *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x183,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"cs.data ()","arr.data ()",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x184,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_40.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<long,long>
            (local_38,"s.size ()","static_cast<std::ptrdiff_t> (arr.size ())",(long *)&local_48,
             (long *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x188,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"s.data ()","arr.data ()",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x189,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_40.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<long,long>
            (local_38,"cs.size ()","static_cast<std::ptrdiff_t> (arr.size ())",(long *)&local_48,
             (long *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x18c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int_const*,int*>
            (local_38,"cs.data ()","arr.data ()",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x18d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_40.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<long,long>
            (local_38,"s.size ()","static_cast<std::ptrdiff_t> (arr.size ())",(long *)&local_48,
             (long *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x1b0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  local_40.data_ = (AssertHelperData *)&local_28;
  testing::internal::CmpHelperEQ<int*,int*>
            (local_38,"s.data ()","arr.data ()",(int **)&local_48,(int **)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar1 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x1b1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST (GslSpan, FromStdArrayConstructor) {
    std::array<int, 4> arr = {{1, 2, 3, 4}};

    {
        span<int> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());

        span<int, 4> cs{arr};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (cs.data (), arr.data ());
    }
    {
        span<int, 4> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());

        span<int const, 4> cs{arr};
        EXPECT_EQ (cs.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (cs.data (), arr.data ());
    }

#ifdef CONFIRM_COMPILATION_ERRORS
    {
        span<int, 2> s{arr};
        EXPECT_EQ (s.size () == 2 && s.data (), arr.data ());

        span<const int, 2> cs{arr};
        EXPECT_EQ (cs.size () == 2 && cs.data (), arr.data ());
    }
    {
        span<int, 0> s{arr};
        EXPECT_EQ (s.size () == 0 && s.data (), arr.data ());

        span<const int, 0> cs{arr};
        EXPECT_EQ (cs.size () == 0 && cs.data (), arr.data ());
    }
    { span<int, 5> s{arr}; }
    {
        auto get_an_array = [] () -> std::array<int, 4> { return {1, 2, 3, 4}; };
        auto take_a_span = [] (span<int> s) { static_cast<void> (s); };
        // try to take a temporary std::array
        take_a_span (get_an_array ());
    }
#endif

    {
        auto get_an_array = [] () -> std::array<int, 4> { return {{1, 2, 3, 4}}; };
        auto take_a_span = [] (span<int const> s) { static_cast<void> (s); };
        // try to take a temporary std::array
        take_a_span (span<int const, 4>{get_an_array ()});
    }
    {
        auto s = make_span (arr);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());
    }
}